

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

TValue * lj_meta_cat(lua_State *L,TValue *top,int left)

{
  SBuf *sb;
  uint uVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  GCstr *pGVar5;
  cTValue *pcVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  iVar7 = -left;
  if (0 < left) {
    iVar7 = left;
  }
  do {
    uVar1 = (top->field_2).it;
    if ((uVar1 != 0xfffffffb && 0xfffeffff < uVar1) ||
       (0xfffeffff < *(uint *)((long)top + -4) && *(uint *)((long)top + -4) != 0xfffffffb)) {
      pcVar6 = lj_meta_lookup(L,top + -1,MM_concat);
      if (((pcVar6->field_2).it == 0xffffffff) &&
         (pcVar6 = lj_meta_lookup(L,top,MM_concat), (pcVar6->field_2).it == 0xffffffff)) {
        lj_err_optype(L,top + ((ulong)(*(uint *)((long)top + -4) < 0xffff0000 ||
                                      *(uint *)((long)top + -4) == 0xfffffffb) - 1),LJ_ERR_OPCAT);
      }
      top[1] = top[-1];
      top[2].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)top;
      *top = *pcVar6;
      top[-1].n = 3.83345534608223e-320;
      return top + 1;
    }
    uVar9 = 0x20;
    if (uVar1 == 0xfffffffb) {
      uVar9 = (ulong)*(uint *)((ulong)(top->u32).lo + 0xc);
    }
    piVar2 = (int *)((long)top + -4);
    do {
      iVar8 = iVar7;
      piVar3 = piVar2;
      uVar4 = 0x20;
      if (*piVar3 == -5) {
        uVar4 = (ulong)*(uint *)((ulong)(uint)piVar3[-1] + 0xc);
      }
      uVar9 = uVar9 + uVar4;
      if (iVar8 < 2) break;
      piVar2 = piVar3 + -2;
      iVar7 = iVar8 + -1;
    } while ((uint)piVar3[-2] < 0xffff0000 || piVar3[-2] == 0xfffffffb);
    if (0x7ffffeff < uVar9) {
      lj_err_msg(L,LJ_ERR_STROV);
    }
    uVar4 = (ulong)(L->glref).ptr32;
    sb = (SBuf *)(uVar4 + 0xe8);
    *(int *)(uVar4 + 0xf4) = (int)L;
    *(int *)(uVar4 + 0xe8) = *(int *)(uVar4 + 0xf0);
    if ((uint)(*(int *)(uVar4 + 0xec) - *(int *)(uVar4 + 0xf0)) < (uint)uVar9) {
      lj_buf_more2(sb,(uint)uVar9);
    }
    for (pcVar6 = (cTValue *)(piVar3 + -1); pcVar6 <= top; pcVar6 = pcVar6 + 1) {
      if ((pcVar6->field_2).it == 0xfffffffb) {
        lj_buf_putmem(sb,(void *)((ulong)(pcVar6->u32).lo + 0x10),
                      *(MSize *)((ulong)(pcVar6->u32).lo + 0xc));
      }
      else {
        lj_strfmt_putfnum(sb,0xf000035,pcVar6->n);
      }
    }
    pGVar5 = lj_str_new(L,(char *)(ulong)*(uint *)(uVar4 + 0xf0),
                        (ulong)(*(int *)(uVar4 + 0xe8) - *(uint *)(uVar4 + 0xf0)));
    piVar3[-1] = (int)pGVar5;
    *piVar3 = -5;
    top = (cTValue *)(piVar3 + -1);
    iVar7 = iVar8 + -1;
    if (iVar8 < 2) {
      uVar9 = (ulong)(L->glref).ptr32;
      if (*(uint *)(uVar9 + 0x54) <= *(uint *)(uVar9 + 0x50)) {
        if (-1 < left) {
          L->top = L->base + *(byte *)((ulong)*(uint *)((ulong)L->base[-1].u32.lo + 0x10) - 0x39);
        }
        lj_gc_step(L);
      }
      return (TValue *)0x0;
    }
  } while( true );
}

Assistant:

TValue *lj_meta_cat(lua_State *L, TValue *top, int left)
{
  int fromc = 0;
  if (left < 0) { left = -left; fromc = 1; }
  do {
    if (!(tvisstr(top) || tvisnumber(top)) ||
	!(tvisstr(top-1) || tvisnumber(top-1))) {
      cTValue *mo = lj_meta_lookup(L, top-1, MM_concat);
      if (tvisnil(mo)) {
	mo = lj_meta_lookup(L, top, MM_concat);
	if (tvisnil(mo)) {
	  if (tvisstr(top-1) || tvisnumber(top-1)) top++;
	  lj_err_optype(L, top-1, LJ_ERR_OPCAT);
	  return NULL;  /* unreachable */
	}
      }
      /* One of the top two elements is not a string, call __cat metamethod:
      **
      ** before:    [...][CAT stack .........................]
      **                                 top-1     top         top+1 top+2
      ** pick two:  [...][CAT stack ...] [o1]      [o2]
      ** setup mm:  [...][CAT stack ...] [cont|?]  [mo|tmtype] [o1]  [o2]
      ** in asm:    [...][CAT stack ...] [cont|PC] [mo|delta]  [o1]  [o2]
      **            ^-- func base                              ^-- mm base
      ** after mm:  [...][CAT stack ...] <--push-- [result]
      ** next step: [...][CAT stack .............]
      */
      copyTV(L, top+2*LJ_FR2+2, top);  /* Carefully ordered stack copies! */
      copyTV(L, top+2*LJ_FR2+1, top-1);
      copyTV(L, top+LJ_FR2, mo);
      setcont(top-1, lj_cont_cat);
      if (LJ_FR2) { setnilV(top); setnilV(top+2); top += 2; }
      return top+1;  /* Trigger metamethod call. */
    } else {
      /* Pick as many strings as possible from the top and concatenate them:
      **
      ** before:    [...][CAT stack ...........................]
      ** pick str:  [...][CAT stack ...] [...... strings ......]
      ** concat:    [...][CAT stack ...] [result]
      ** next step: [...][CAT stack ............]
      */
      TValue *e, *o = top;
      uint64_t tlen = tvisstr(o) ? strV(o)->len : STRFMT_MAXBUF_NUM;
      SBuf *sb;
      do {
	o--; tlen += tvisstr(o) ? strV(o)->len : STRFMT_MAXBUF_NUM;
      } while (--left > 0 && (tvisstr(o-1) || tvisnumber(o-1)));
      if (tlen >= LJ_MAX_STR) lj_err_msg(L, LJ_ERR_STROV);
      sb = lj_buf_tmp_(L);
      lj_buf_more(sb, (MSize)tlen);
      for (e = top, top = o; o <= e; o++) {
	if (tvisstr(o)) {
	  GCstr *s = strV(o);
	  MSize len = s->len;
	  lj_buf_putmem(sb, strdata(s), len);
	} else if (tvisint(o)) {
	  lj_strfmt_putint(sb, intV(o));
	} else {
	  lj_strfmt_putfnum(sb, STRFMT_G14, numV(o));
	}
      }
      setstrV(L, top, lj_buf_str(L, sb));
    }
  } while (left >= 1);
  if (LJ_UNLIKELY(G(L)->gc.total >= G(L)->gc.threshold)) {
    if (!fromc) L->top = curr_topL(L);
    lj_gc_step(L);
  }
  return NULL;
}